

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O3

double __thiscall
HighsDomain::adjustedUb(HighsDomain *this,HighsInt col,HighsCDouble boundVal,bool *accept)

{
  HighsMipSolver *pHVar1;
  HighsMipSolverData *pHVar2;
  bool bVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  dVar6 = boundVal.lo;
  dVar5 = boundVal.hi;
  pHVar1 = this->mipsolver;
  if ((pHVar1->model_->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>
      ._M_impl.super__Vector_impl_data._M_start[col] == kContinuous) {
    dVar7 = (this->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[col];
    pHVar2 = (pHVar1->mipdata_)._M_t.
             super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
             _M_t.
             super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
             super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
    uVar4 = -(ulong)(pHVar2->epsilon < ABS((dVar5 + dVar6) - dVar7));
    dVar6 = (double)(~uVar4 & (ulong)dVar7 | (ulong)(dVar5 + dVar6) & uVar4);
    dVar5 = (this->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[col];
    bVar3 = true;
    if (INFINITY <= dVar5) goto LAB_002937e0;
    if (pHVar2->feastol * 1000.0 + dVar6 < dVar5) {
      if (dVar7 <= -INFINITY) {
        dVar7 = ABS(dVar6);
        if (ABS(dVar6) <= ABS(dVar5)) {
          dVar7 = ABS(dVar5);
        }
      }
      else {
        dVar7 = dVar5 - dVar7;
      }
      bVar3 = 0.3 <= (dVar5 - dVar6) / dVar7;
      goto LAB_002937e0;
    }
  }
  else {
    dVar7 = ((pHVar1->mipdata_)._M_t.
             super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
             _M_t.
             super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
             super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol;
    dVar8 = dVar7 + dVar5;
    dVar9 = dVar8 - dVar5;
    dVar5 = floor((dVar7 - dVar9) + (dVar5 - (dVar8 - dVar9)) + dVar6);
    dVar6 = dVar6 + dVar5;
    dVar5 = (this->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[col];
    if (dVar6 < dVar5) {
      bVar3 = ABS(dVar6) *
              ((this->mipsolver->mipdata_)._M_t.
               super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
               _M_t.
               super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
               .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol * 1000.0 <
              dVar5 - dVar6;
      goto LAB_002937e0;
    }
  }
  bVar3 = false;
LAB_002937e0:
  *accept = bVar3;
  return dVar6;
}

Assistant:

double HighsDomain::adjustedUb(HighsInt col, HighsCDouble boundVal,
                               bool& accept) const {
  double bound;

  if (mipsolver->variableType(col) != HighsVarType::kContinuous) {
    bound = static_cast<double>(floor(boundVal + mipsolver->mipdata_->feastol));
    accept = bound < col_upper_[col] &&
             col_upper_[col] - bound >
                 1000.0 * mipsolver->mipdata_->feastol * std::fabs(bound);
  } else {
    if (std::fabs(double(boundVal) - col_lower_[col]) <=
        mipsolver->mipdata_->epsilon)
      bound = col_lower_[col];
    else
      bound = double(boundVal);
    if (col_upper_[col] == kHighsInf)
      accept = true;
    else if (bound + 1000.0 * mipsolver->mipdata_->feastol < col_upper_[col]) {
      double relativeImprove = col_upper_[col] - bound;
      if (col_lower_[col] != -kHighsInf)
        relativeImprove /= col_upper_[col] - col_lower_[col];
      else
        relativeImprove /=
            std::max(std::fabs(col_upper_[col]), std::fabs(bound));
      accept = relativeImprove >= 0.3;
    } else
      accept = false;
  }

  return bound;
}